

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_flush_mips64(CPUState *cpu)

{
  uint *puVar1;
  uc_struct_conflict7 *puVar2;
  uint i;
  long lVar3;
  void **extraout_RDX;
  void **lp;
  void **extraout_RDX_00;
  ulong uVar4;
  ulong uVar5;
  
  for (lVar3 = 0; lVar3 != 0x1000; lVar3 = lVar3 + 1) {
    cpu->tb_jmp_cache[lVar3] = (TranslationBlock *)0x0;
  }
  qht_reset_size((uc_struct_conflict5 *)cpu->uc,&(cpu->uc->tcg_ctx->tb_ctx).htable,0x8000);
  puVar2 = cpu->uc;
  uVar4 = 0;
  uVar5 = (ulong)(uint)puVar2->v_l1_size;
  if (puVar2->v_l1_size < 1) {
    uVar5 = uVar4;
  }
  lp = extraout_RDX;
  for (; uVar5 * 8 != uVar4; uVar4 = uVar4 + 8) {
    page_flush_tb_1((uc_struct_conflict6 *)(ulong)(uint)puVar2->v_l2_levels,
                    (int)puVar2->l1_map + (int)uVar4,lp);
    lp = extraout_RDX_00;
  }
  tcg_region_reset_all_mips64((TCGContext_conflict5 *)cpu->uc->tcg_ctx);
  puVar1 = &(cpu->uc->tcg_ctx->tb_ctx).tb_flush_count;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void tb_flush(CPUState *cpu)
{
    unsigned tb_flush_count = cpu->uc->tcg_ctx->tb_ctx.tb_flush_count;
    do_tb_flush(cpu, RUN_ON_CPU_HOST_INT(tb_flush_count));
}